

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

void __thiscall
ser::Serializer::Init(Serializer *this,string *directory,string *prefix,SerializerOpenMode mode)

{
  bool bVar1;
  int iVar2;
  CentralizedFileFormat *this_00;
  type this_01;
  type pFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  undefined1 local_40 [8];
  shared_ptr<ser::CentralizedFileFormat> fileFormat;
  char *envvar;
  SerializerOpenMode mode_local;
  string *prefix_local;
  string *directory_local;
  Serializer *this_local;
  
  if (enabled_ == 0) {
    fileFormat.pn.pi_ = (sp_counted_base *)getenv("STELLA_SERIALIZATION_DISABLED");
    bVar1 = false;
    if (fileFormat.pn.pi_ != (sp_counted_base *)0x0) {
      iVar2 = atoi((char *)fileFormat.pn.pi_);
      bVar1 = 0 < iVar2;
    }
    enabled_ = 1;
    if (bVar1) {
      enabled_ = -1;
    }
  }
  this->mode_ = mode;
  this_00 = (CentralizedFileFormat *)operator_new(0x80);
  CentralizedFileFormat::CentralizedFileFormat(this_00);
  boost::shared_ptr<ser::CentralizedFileFormat>::shared_ptr<ser::CentralizedFileFormat>
            ((shared_ptr<ser::CentralizedFileFormat> *)local_40,this_00);
  this_01 = boost::shared_ptr<ser::CentralizedFileFormat>::operator->
                      ((shared_ptr<ser::CentralizedFileFormat> *)local_40);
  CentralizedFileFormat::Init
            (this_01,directory,prefix,&this->globalMetainfo_,&this->fieldsTable_,&this->offsetTable_
            );
  boost::shared_ptr<ser::FileFormat>::operator=
            (&this->pFileFormat_,(shared_ptr<ser::CentralizedFileFormat> *)local_40);
  if (this->mode_ == SerializerOpenModeWrite) {
    pFVar3 = boost::shared_ptr<ser::FileFormat>::operator->(&this->pFileFormat_);
    (*pFVar3->_vptr_FileFormat[5])();
  }
  else {
    pFVar3 = boost::shared_ptr<ser::FileFormat>::operator->(&this->pFileFormat_);
    (*pFVar3->_vptr_FileFormat[3])();
  }
  BinarySerializer::Init(&this->binarySerializer_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"__format",&local_71);
  bVar1 = MetainfoSet::HasKey(&this->globalMetainfo_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"__format",&local_99);
    pFVar3 = boost::shared_ptr<ser::FileFormat>::operator->(&this->pFileFormat_);
    (*pFVar3->_vptr_FileFormat[2])(&local_c0);
    MetainfoSet::AddMetainfo<std::__cxx11::string>(&this->globalMetainfo_,&local_98,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  boost::shared_ptr<ser::CentralizedFileFormat>::~shared_ptr
            ((shared_ptr<ser::CentralizedFileFormat> *)local_40);
  return;
}

Assistant:

void Serializer::Init(const std::string& directory, const std::string& prefix, SerializerOpenMode mode)
{
    // Set the enabled_ flag to something different than 0
    if (enabled_ == 0)
    {
        const char* envvar = std::getenv("STELLA_SERIALIZATION_DISABLED");
        enabled_ = (envvar && std::atoi(envvar) > 0) ? -1 : 1;
    }

    mode_ = mode;

    // Initialize file type, as it will also fill the tables
    boost::shared_ptr<CentralizedFileFormat> fileFormat(new CentralizedFileFormat);
    fileFormat->Init(directory, prefix, globalMetainfo_, fieldsTable_, offsetTable_);
    pFileFormat_ = fileFormat;

    // Clean the tables if mode is write
    if (mode_ == SerializerOpenModeWrite)
        pFileFormat_->CleanTables();
    else
        pFileFormat_->ImportTables();

    // Initiaize binary serializer
    binarySerializer_.Init();

    // Register basic metainfo
    if (!globalMetainfo_.HasKey("__format"))
        globalMetainfo_.AddMetainfo("__format", pFileFormat_->FormatName());
    //if (!globalMetainfo_.HasKey("__created"))
    //    globalMetainfo_.AddMetainfo("__created", /* TODO : add date (timestamp) */);
}